

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.c
# Opt level: O3

int delay_segment_start(mixed_segment *segment)

{
  long *plVar1;
  uint32_t size;
  int iVar2;
  mixed_buffer *buffer;
  float *out;
  uint32_t samples;
  float *local_20;
  uint32_t local_14;
  
  plVar1 = (long *)segment->data;
  if ((*plVar1 == 0) || (plVar1[1] == 0)) {
    mixed_err(0x16);
    iVar2 = 0;
  }
  else {
    buffer = (mixed_buffer *)(plVar1 + 2);
    mixed_buffer_clear(buffer);
    local_14 = 0xffffffff;
    mixed_buffer_request_write(&local_20,&local_14,buffer);
    size = local_14;
    if ((ulong)local_14 != 0) {
      memset(local_20,0,(ulong)local_14 * 4);
    }
    mixed_buffer_finish_write(size,buffer);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int delay_segment_start(struct mixed_segment *segment){
  struct delay_segment_data *data = (struct delay_segment_data *)segment->data;
  if(data->in == 0 || data->out == 0){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  // Fill the entire buffer with nothing to initiate the delay.
  mixed_buffer_clear(&data->buffer);
  uint32_t samples = UINT32_MAX;
  float *out;
  mixed_buffer_request_write(&out, &samples, &data->buffer);
  for(uint32_t i=0; i<samples; ++i){
    out[i] = 0.0f;
  }
  mixed_buffer_finish_write(samples, &data->buffer);
  return 1;
}